

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O0

bool __thiscall
cmCMakePolicyCommand::HandleGetWarningMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  string *name;
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  ostream *poVar4;
  PolicyID id_00;
  string local_228;
  string local_208;
  ostringstream local_1e8 [8];
  ostringstream e;
  PolicyID local_6c;
  const_reference pvStack_68;
  PolicyID pid;
  string *var;
  string *id;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCMakePolicyCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 == 3) {
    var = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_20,1);
    pvStack_68 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,2);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmPolicies::GetPolicyID(pcVar3,&local_6c);
    name = pvStack_68;
    if (bVar1) {
      this_00 = (this->super_cmCommand).Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_228,(cmPolicies *)(ulong)local_6c,id_00);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,name,pcVar3);
      std::__cxx11::string::~string((string *)&local_228);
      this_local._7_1_ = 1;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1e8);
      poVar4 = std::operator<<((ostream *)local_1e8,"GET_WARNING given policy \"");
      poVar4 = std::operator<<(poVar4,(string *)var);
      std::operator<<(poVar4,"\" which is not known to this version of CMake.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1e8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GET_WARNING must be given exactly 2 additional arguments.",
               &local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakePolicyCommand::HandleGetWarningMode(
  std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError(
      "GET_WARNING must be given exactly 2 additional arguments.");
    return false;
  }

  // Get arguments.
  std::string const& id = args[1];
  std::string const& var = args[2];

  // Lookup the policy number.
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id.c_str(), pid)) {
    std::ostringstream e;
    e << "GET_WARNING given policy \"" << id
      << "\" which is not known to this version of CMake.";
    this->SetError(e.str());
    return false;
  }

  // Lookup the policy warning.
  this->Makefile->AddDefinition(var,
                                cmPolicies::GetPolicyWarning(pid).c_str());

  return true;
}